

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeSourceMapProlog(WasmBinaryWriter *this)

{
  bool bVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_> *this_00;
  size_type sVar4;
  ostream *poVar5;
  void *this_01;
  byte *pbVar6;
  size_t in_RCX;
  void *__buf;
  anon_class_8_1_8991fb9c local_a0;
  anon_class_8_1_8991fb9c writeStringVector;
  anon_class_8_1_8991fb9c writeOptionalString;
  ulong local_88;
  size_t i;
  anon_class_16_2_dafab078 local_70;
  function<unsigned_char_()> local_60;
  size_t local_40;
  size_t pos;
  reference pCStack_30;
  U32LEB ret;
  CustomSection *section;
  iterator __end1;
  iterator __begin1;
  vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_> *__range1;
  WasmBinaryWriter *this_local;
  
  std::operator<<(this->sourceMap,"{\"version\":3,");
  this_00 = &this->wasm->customSections;
  __end1 = std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::begin(this_00);
  section = (CustomSection *)
            std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
                                *)&section);
    if (!bVar1) {
LAB_025b86b1:
      writeStringVector.this = this;
      writeSourceMapProlog::anon_class_8_1_8991fb9c::operator()
                (&writeStringVector,"file",&this->wasm->debugInfoFile);
      writeSourceMapProlog::anon_class_8_1_8991fb9c::operator()
                (&writeStringVector,"sourceRoot",&this->wasm->debugInfoSourceRoot);
      local_a0.this = this;
      writeSourceMapProlog::anon_class_8_1_8991fb9c::operator()
                (&local_a0,"sources",&this->wasm->debugInfoFileNames);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->wasm->debugInfoSourcesContent);
      if (!bVar1) {
        writeSourceMapProlog::anon_class_8_1_8991fb9c::operator()
                  (&local_a0,"sourcesContent",&this->wasm->debugInfoSourcesContent);
      }
      writeSourceMapProlog::anon_class_8_1_8991fb9c::operator()
                (&local_a0,"names",&this->wasm->debugInfoSymbolNames);
      std::operator<<(this->sourceMap,"\"mappings\":\"");
      return;
    }
    pCStack_30 = __gnu_cxx::
                 __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
                 ::operator*(&__end1);
    bVar1 = std::operator==(&pCStack_30->name,BinaryConsts::CustomSections::BuildId);
    if (bVar1) {
      local_40 = 0;
      local_70.section = pCStack_30;
      local_70.pos = &local_40;
      std::function<unsigned_char()>::
      function<wasm::WasmBinaryWriter::writeSourceMapProlog()::__0,void>
                ((function<unsigned_char()> *)&local_60,&local_70);
      LEB<unsigned_int,_unsigned_char>::read
                ((LEB<unsigned_int,_unsigned_char> *)((long)&pos + 4),(int)&local_60,__buf,in_RCX);
      std::function<unsigned_char_()>::~function(&local_60);
      sVar4 = std::vector<char,_std::allocator<char>_>::size(&pCStack_30->data);
      if (sVar4 == local_40 + pos._4_4_) {
        std::operator<<(this->sourceMap,"\"debugId\":\"");
        for (local_88 = local_40;
            sVar4 = std::vector<char,_std::allocator<char>_>::size(&pCStack_30->data),
            local_88 < sVar4; local_88 = local_88 + 1) {
          poVar5 = this->sourceMap;
          _Var2 = std::setfill<char>('0');
          poVar5 = std::operator<<(poVar5,_Var2._M_c);
          _Var3 = std::setw(2);
          poVar5 = std::operator<<(poVar5,_Var3);
          this_01 = (void *)std::ostream::operator<<(poVar5,std::hex);
          pbVar6 = (byte *)std::vector<char,_std::allocator<char>_>::operator[]
                                     (&pCStack_30->data,local_88);
          std::ostream::operator<<(this_01,(uint)*pbVar6);
        }
        std::operator<<(this->sourceMap,"\",");
      }
      else {
        std::operator<<((ostream *)&std::cerr,
                        "warning: build id section with an incorrect size detected!\n");
      }
      goto LAB_025b86b1;
    }
    __gnu_cxx::
    __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void WasmBinaryWriter::writeSourceMapProlog() {
  *sourceMap << "{\"version\":3,";

  for (const auto& section : wasm->customSections) {
    if (section.name == BinaryConsts::CustomSections::BuildId) {
      U32LEB ret;
      size_t pos = 0;
      ret.read([&]() { return section.data[pos++]; });

      if (section.data.size() != pos + ret.value) {
        std::cerr
          << "warning: build id section with an incorrect size detected!\n";
        break;
      }

      *sourceMap << "\"debugId\":\"";
      for (size_t i = pos; i < section.data.size(); i++) {
        *sourceMap << std::setfill('0') << std::setw(2) << std::hex
                   << static_cast<int>(static_cast<uint8_t>(section.data[i]));
      }
      *sourceMap << "\",";
      break;
    }
  }

  auto writeOptionalString = [&](const char* name, const std::string& str) {
    if (!str.empty()) {
      *sourceMap << "\"" << name << "\":\"" << str << "\",";
    }
  };

  writeOptionalString("file", wasm->debugInfoFile);
  writeOptionalString("sourceRoot", wasm->debugInfoSourceRoot);

  auto writeStringVector = [&](const char* name,
                               const std::vector<std::string>& vec) {
    *sourceMap << "\"" << name << "\":[";
    for (size_t i = 0; i < vec.size(); i++) {
      if (i > 0) {
        *sourceMap << ",";
      }
      *sourceMap << "\"" << vec[i] << "\"";
    }
    *sourceMap << "],";
  };

  writeStringVector("sources", wasm->debugInfoFileNames);

  if (!wasm->debugInfoSourcesContent.empty()) {
    writeStringVector("sourcesContent", wasm->debugInfoSourcesContent);
  }

  // TODO: This field is optional; maybe we should omit if it's empty.
  // TODO: Binaryen actually does not correctly preserve symbol names when it
  // rewrites the mappings. We should maybe just drop them, or else handle
  // them correctly.
  writeStringVector("names", wasm->debugInfoSymbolNames);

  *sourceMap << "\"mappings\":\"";
}